

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
 __thiscall
pstore::command_line::details::
parse_option_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::ostringstream>
          (details *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first_arg,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          last_arg,string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  type *ptVar4;
  option **ppoVar5;
  ostream *poVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  extraout_RDX_09;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  bool bVar14;
  details dVar15;
  tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  tVar16;
  maybe<pstore::command_line::option_*,_void> handler;
  string arg_name;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  maybe<pstore::command_line::option_*,_void> local_158;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *local_148;
  string *local_140;
  details local_138 [8];
  option *local_130;
  maybe<pstore::command_line::option_*,_void> local_128;
  maybe<pstore::command_line::option_*,_void> local_118;
  string local_108;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_e8;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  details *local_80;
  undefined1 local_78 [8];
  type local_70;
  long *local_50 [2];
  long local_40 [2];
  uint uVar12;
  
  local_e8.storage_._8_8_ = 0;
  local_e8.storage_._16_8_ = 0;
  local_e8._0_8_ = 0;
  local_e8.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8.storage_._24_8_ = 0;
  local_158._0_8_ = 0;
  local_158.storage_ = (type)0x0;
  local_148 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)program_name;
  local_140 = (string *)errs;
  if (first_arg._M_current == last_arg._M_current) {
    bVar10 = 1;
  }
  else {
    uVar12 = 1;
    _Var13._M_current = first_arg._M_current;
    local_80 = this;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pcVar1 = ((_Var13._M_current)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + (_Var13._M_current)->_M_string_length);
      local_118.valid_ = false;
      bVar14 = local_158.valid_ == true;
      if (bVar14) {
        ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
        local_118.storage_ = *ptVar4;
      }
      local_118.valid_ = bVar14;
      bVar14 = handler_takes_argument(&local_118);
      if (local_118.valid_ == true) {
        local_118.valid_ = false;
      }
      if (bVar14) {
        local_128.valid_ = false;
        bVar14 = local_158.valid_ == true;
        if (bVar14) {
          ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
          local_128.storage_ = *ptVar4;
        }
        local_128.valid_ = bVar14;
        bVar14 = handler_set_value(&local_128,&local_108);
        uVar11 = uVar12 & 0xff;
        if ((uVar12 & 1) != 0) {
          uVar11 = (uint)bVar14;
        }
        if (local_128.valid_ == true) {
          local_128.valid_ = false;
        }
        pbVar8 = extraout_RDX;
        if (local_158.valid_ == true) {
          local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
        }
        goto LAB_0013eb87;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_108);
      if (iVar3 == 0) {
        _Var13._M_current = _Var13._M_current + 1;
        bVar14 = true;
        pbVar8 = extraout_RDX_00;
      }
      else {
        bVar2 = argument_is_positional(&local_108);
        bVar14 = true;
        pbVar8 = extraout_RDX_01;
        if (!bVar2) {
          bVar14 = starts_with(&local_108,"--");
          if (bVar14) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            get_option_and_value
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                        *)local_78,&local_a0);
            std::__cxx11::string::operator=((string *)&local_108,(string *)local_50);
            maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator=(&local_e8,
                        (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)local_78);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_78[0] == true) {
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              if ((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]) != local_78 + 0x18) {
                operator_delete((undefined1 *)CONCAT71(local_70._1_7_,local_70.__data[0]),
                                local_70._16_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            find_handler((maybe<pstore::command_line::option_*,_void> *)local_78,&local_108);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_158,(maybe<pstore::command_line::option_*,_void> *)local_78);
            if (local_158.valid_ == true) {
              ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
              iVar3 = (*(*ppoVar5)->_vptr_option[9])();
              if ((char)iVar3 == '\0') {
                local_138[0] = (details)0x0;
                dVar15 = (details)(local_158.valid_ == true);
                if ((bool)dVar15) {
                  ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
                  local_130 = *ppoVar5;
                }
                errs = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140;
                local_138[0] = dVar15;
                record_value_if_available<std::__cxx11::ostringstream>
                          ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)
                           local_78,local_138,
                           (maybe<pstore::command_line::option_*,_void> *)&local_e8,local_148,
                           local_140,in_R9);
                maybe<pstore::command_line::option_*,_void>::operator=
                          (&local_158,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8))
                ;
                uVar11 = local_78._0_4_;
                if ((uVar12 & 1) == 0) {
                  uVar11 = uVar12 & 0xff;
                }
                pbVar8 = extraout_RDX_06;
                if (local_138[0] == (details)0x1) {
                  local_138[0] = (details)0x0;
                }
                goto LAB_0013eb87;
              }
            }
            report_unknown_option<std::__cxx11::ostringstream>
                      ((string *)local_148,&local_108,&local_e8,
                       (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
            bVar14 = false;
            uVar11 = uVar12 & 1;
            pbVar8 = extraout_RDX_02;
            uVar12 = uVar12 & 0xff;
            if (uVar11 != 0) {
              uVar12 = 0;
            }
          }
          else {
            local_c0[0] = local_b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c0,local_108._M_dataplus._M_p,
                       local_108._M_dataplus._M_p + local_108._M_string_length);
            process_single_dash<std::__cxx11::ostringstream>
                      ((tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *)local_78,
                       (details *)local_c0,(string *)local_148,local_140,errs);
            maybe<pstore::command_line::option_*,_void>::operator=
                      (&local_158,(maybe<pstore::command_line::option_*,_void> *)(local_78 + 8));
            uVar11 = local_78._0_4_;
            if ((uVar12 & 1) == 0) {
              uVar11 = uVar12 & 0xff;
            }
            if ((bool)local_70.__data[0] == true) {
              local_70.__data[0] = false;
            }
            pbVar8 = extraout_RDX_04;
            if (local_c0[0] != local_b0) {
              operator_delete(local_c0[0],local_b0[0] + 1);
              pbVar8 = extraout_RDX_05;
            }
LAB_0013eb87:
            bVar14 = false;
            uVar12 = uVar11;
          }
        }
      }
      bVar9 = (byte)uVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        pbVar8 = extraout_RDX_03;
      }
      this = local_80;
      first_arg._M_current = _Var13._M_current;
    } while ((!bVar14) &&
            (_Var13._M_current = _Var13._M_current + 1, first_arg._M_current = last_arg._M_current,
            _Var13._M_current != last_arg._M_current));
    last_arg._M_current = pbVar8;
    bVar10 = bVar9;
    if ((local_158._0_8_ & 1) != 0) {
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
      iVar3 = (*(*ppoVar5)->_vptr_option[0xe])();
      last_arg._M_current = extraout_RDX_07;
      if ((char)iVar3 != '\0') {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_140,*(char **)local_148,
                            (long)(local_148->storage_).__align);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Argument \'",0xc);
        ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_158);
        psVar7 = option::name_abi_cxx11_(*ppoVar5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' requires a value\n",0x13);
        last_arg._M_current = extraout_RDX_08;
        bVar10 = 0;
        if ((uVar12 & 1) == 0) {
          bVar10 = bVar9;
        }
      }
    }
  }
  *this = (details)(bVar10 & 1);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8) =
       first_arg._M_current;
  if ((local_e8.valid_ == true) &&
     (local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00,
     local_e8.storage_.__align !=
     (anon_struct_8_0_00000001_for___align)((long)&local_e8.storage_ + 0x10))) {
    operator_delete((void *)local_e8.storage_.__align,local_e8.storage_._16_8_ + 1);
    last_arg._M_current = extraout_RDX_09._M_current;
  }
  tVar16.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  ._M_head_impl._M_current =
       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )last_arg._M_current;
  tVar16.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  ._0_8_ = this;
  return (tuple<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
          )tVar16.
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  ;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }